

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

ProxyWithLink * __thiscall diy::Master::proxy(Master *this,int i,IExchangeInfo *iex)

{
  int iVar1;
  undefined4 extraout_var;
  uint in_EDX;
  char *__to;
  Master *in_RSI;
  Master *in_RDI;
  Proxy *unaff_retaddr;
  undefined8 in_stack_ffffffffffffff18;
  Master *proxy;
  Proxy *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  Master *pMVar2;
  Master *master__;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  proxy = in_RDI;
  pMVar2 = in_RSI;
  master__ = in_RDI;
  gid(in_RDI,iVar1);
  Proxy::Proxy(unaff_retaddr,master__,(int)((ulong)pMVar2 >> 0x20),
               (IExchangeInfo *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  block(in_RDI,iVar1);
  iVar1 = link(in_RSI,(char *)(ulong)in_EDX,__to);
  ProxyWithLink::ProxyWithLink
            ((ProxyWithLink *)in_RSI,(Proxy *)proxy,in_RDI,(Link *)CONCAT44(extraout_var,iVar1));
  Proxy::~Proxy(in_stack_ffffffffffffffc0);
  return (ProxyWithLink *)proxy;
}

Assistant:

int
diy::Master::
add(int gid__, void* b, Link* l)
{
  if (*blocks_.in_memory().const_access() == limit_)
    unload_all();

  lock_guard<fast_mutex>    lock(add_mutex_);       // allow to add blocks from multiple threads

  blocks_.add(b);
  links_.push_back(l);
  gids_.push_back(gid__);

  int lid__ = static_cast<int>(gids_.size()) - 1;
  lids_[gid__] = lid__;
  add_expected(l->size_unique()); // NB: at every iteration we expect a message from each unique neighbor

  return lid__;
}